

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_sync_handler_failed_application_exception_branch
          (t_rs_generator *this,t_function *tfunc,string *app_err_var)

{
  bool bVar1;
  ostream *poVar2;
  string local_40;
  string *local_20;
  string *app_err_var_local;
  t_function *tfunc_local;
  t_rs_generator *this_local;
  
  local_20 = app_err_var;
  app_err_var_local = (string *)tfunc;
  tfunc_local = (t_function *)this;
  bVar1 = t_function::is_oneway(tfunc);
  if (bVar1) {
    t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_40);
    poVar2 = std::operator<<(poVar2,"Err(thrift::Error::Application(");
    poVar2 = std::operator<<(poVar2,(string *)local_20);
    poVar2 = std::operator<<(poVar2,"))");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    render_sync_handler_send_exception_response(this,(t_function *)app_err_var_local,local_20);
  }
  return;
}

Assistant:

void t_rs_generator::render_sync_handler_failed_application_exception_branch(
    t_function *tfunc,
    const string &app_err_var
) {
  if (tfunc->is_oneway()) {
    f_gen_ << indent() << "Err(thrift::Error::Application(" << app_err_var << "))" << endl;
  } else {
    render_sync_handler_send_exception_response(tfunc, app_err_var);
  }
}